

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O1

void update_ext_partition_context
               (MACROBLOCKD *xd,int mi_row,int mi_col,BLOCK_SIZE subsize,BLOCK_SIZE bsize,
               PARTITION_TYPE partition)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  ulong __n;
  long lVar4;
  PARTITION_CONTEXT *__s;
  uint uVar5;
  ulong uVar6;
  
  if (bsize < BLOCK_8X8) {
    return;
  }
  uVar3 = (ulong)bsize;
  switch(uVar3) {
  case 3:
    lVar4 = 1;
    break;
  case 4:
  case 5:
  case 7:
  case 8:
switchD_001f0398_caseD_4:
    lVar4 = 6;
    bVar2 = true;
    goto LAB_001f03d8;
  case 6:
    lVar4 = 2;
    break;
  case 9:
    lVar4 = 3;
    break;
  default:
    if (bsize == BLOCK_64X64) {
      lVar4 = 4;
    }
    else {
      if (bsize != BLOCK_128X128) goto switchD_001f0398_caseD_4;
      lVar4 = 5;
    }
  }
  bVar2 = false;
LAB_001f03d8:
  uVar6 = 0xff;
  if (!bVar2) {
    uVar6 = (ulong)subsize_lookup[3][lVar4];
  }
  if (9 < partition) {
    return;
  }
  uVar5 = (uint)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar3]
                >> 1);
  switch(partition) {
  case '\x03':
    if (bsize != BLOCK_8X8) {
      return;
    }
  default:
    __s = xd->left_partition_context + (mi_row & 0x1f);
    __n = (ulong)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar3]
    ;
    memset(xd->above_partition_context + mi_col,(uint)(byte)partition_context_lookup[subsize].above,
           (ulong)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                  [uVar3]);
    uVar5 = (uint)(byte)partition_context_lookup[subsize].left;
    break;
  case '\x04':
    bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[subsize];
    __n = (ulong)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [subsize];
    memset(xd->above_partition_context + mi_col,(uint)(byte)partition_context_lookup[uVar6].above,
           (ulong)bVar1);
    memset(xd->left_partition_context + (mi_row & 0x1f),
           (uint)(byte)partition_context_lookup[uVar6].left,__n);
    __s = xd->left_partition_context + (uVar5 + mi_row & 0x1f);
    memset(xd->above_partition_context + mi_col,(uint)(byte)partition_context_lookup[subsize].above,
           (ulong)bVar1);
    uVar5 = (uint)(byte)partition_context_lookup[subsize].left;
    break;
  case '\x05':
    bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[subsize];
    __n = (ulong)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [subsize];
    memset(xd->above_partition_context + mi_col,(uint)(byte)partition_context_lookup[subsize].above,
           (ulong)bVar1);
    memset(xd->left_partition_context + (mi_row & 0x1f),
           (uint)(byte)partition_context_lookup[subsize].left,__n);
    __s = xd->left_partition_context + (uVar5 + mi_row & 0x1f);
    memset(xd->above_partition_context + mi_col,(uint)(byte)partition_context_lookup[uVar6].above,
           (ulong)bVar1);
    uVar5 = (uint)(byte)partition_context_lookup[uVar6].left;
    break;
  case '\x06':
    __s = xd->left_partition_context + (mi_row & 0x1f);
    bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[subsize];
    __n = (ulong)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [subsize];
    memset(xd->above_partition_context + mi_col,(uint)(byte)partition_context_lookup[uVar6].above,
           (ulong)bVar1);
    memset(__s,(uint)(byte)partition_context_lookup[uVar6].left,__n);
    memset(xd->above_partition_context + (int)(uVar5 + mi_col),
           (uint)(byte)partition_context_lookup[subsize].above,(ulong)bVar1);
    uVar5 = (uint)(byte)partition_context_lookup[subsize].left;
    break;
  case '\a':
    __s = xd->left_partition_context + (mi_row & 0x1f);
    bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[subsize];
    __n = (ulong)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [subsize];
    memset(xd->above_partition_context + mi_col,(uint)(byte)partition_context_lookup[subsize].above,
           (ulong)bVar1);
    memset(__s,(uint)(byte)partition_context_lookup[subsize].left,__n);
    memset(xd->above_partition_context + (int)(uVar5 + mi_col),
           (uint)(byte)partition_context_lookup[uVar6].above,(ulong)bVar1);
    uVar5 = (uint)(byte)partition_context_lookup[uVar6].left;
  }
  memset(__s,uVar5,__n);
  return;
}

Assistant:

static inline void update_ext_partition_context(MACROBLOCKD *xd, int mi_row,
                                                int mi_col, BLOCK_SIZE subsize,
                                                BLOCK_SIZE bsize,
                                                PARTITION_TYPE partition) {
  if (bsize >= BLOCK_8X8) {
    const int hbs = mi_size_wide[bsize] / 2;
    BLOCK_SIZE bsize2 = get_partition_subsize(bsize, PARTITION_SPLIT);
    switch (partition) {
      case PARTITION_SPLIT:
        if (bsize != BLOCK_8X8) break;
        AOM_FALLTHROUGH_INTENDED;
      case PARTITION_NONE:
      case PARTITION_HORZ:
      case PARTITION_VERT:
      case PARTITION_HORZ_4:
      case PARTITION_VERT_4:
        update_partition_context(xd, mi_row, mi_col, subsize, bsize);
        break;
      case PARTITION_HORZ_A:
        update_partition_context(xd, mi_row, mi_col, bsize2, subsize);
        update_partition_context(xd, mi_row + hbs, mi_col, subsize, subsize);
        break;
      case PARTITION_HORZ_B:
        update_partition_context(xd, mi_row, mi_col, subsize, subsize);
        update_partition_context(xd, mi_row + hbs, mi_col, bsize2, subsize);
        break;
      case PARTITION_VERT_A:
        update_partition_context(xd, mi_row, mi_col, bsize2, subsize);
        update_partition_context(xd, mi_row, mi_col + hbs, subsize, subsize);
        break;
      case PARTITION_VERT_B:
        update_partition_context(xd, mi_row, mi_col, subsize, subsize);
        update_partition_context(xd, mi_row, mi_col + hbs, bsize2, subsize);
        break;
      default: assert(0 && "Invalid partition type");
    }
  }
}